

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void av1_inv_txfm2d_add_4x4_sse4_1
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined4 uVar1;
  char cVar2;
  int8_t *piVar3;
  undefined4 uVar4;
  int fliplr;
  undefined7 in_register_00000009;
  int flipud;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  longlong lVar26;
  __m128i in [4];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  piVar3 = av1_inv_txfm_shift_ls[0];
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    idct4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    break;
  case 1:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    idct4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    goto LAB_003f991d;
  case 2:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    break;
  case 3:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    goto LAB_003f991d;
  case 4:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    idct4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    goto LAB_003f9d6b;
  case 5:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    uVar1 = (undefined4)uStack_60;
    uVar4 = uStack_60._4_4_;
    uStack_38 = local_58._12_4_;
    uStack_34 = local_48._12_4_;
    lVar26 = CONCAT44(local_48._0_4_,local_58._0_4_);
    uStack_60 = CONCAT44(local_68._4_4_,local_78._4_4_);
    local_58._4_4_ = uVar1;
    local_58._0_4_ = (undefined4)uStack_70;
    local_58._12_4_ = local_48._8_4_;
    local_48._8_4_ = uStack_70._4_4_;
    local_48._12_4_ = uVar4;
    local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
    uStack_70 = lVar26;
    idct4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,1,bd,0);
    goto LAB_003f9a53;
  case 6:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    uVar1 = (undefined4)uStack_60;
    uVar4 = uStack_60._4_4_;
    uStack_38 = local_58._12_4_;
    uStack_34 = local_48._12_4_;
    lVar26 = CONCAT44(local_48._0_4_,local_58._0_4_);
    uStack_60 = CONCAT44(local_68._4_4_,local_78._4_4_);
    local_58._4_4_ = uVar1;
    local_58._0_4_ = (undefined4)uStack_70;
    local_58._12_4_ = local_48._8_4_;
    local_48._8_4_ = uStack_70._4_4_;
    local_48._12_4_ = uVar4;
    local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
    uStack_70 = lVar26;
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,1,bd,0);
    cVar2 = piVar3[1];
    fliplr = 1;
    goto LAB_003f9dfa;
  case 7:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    uVar1 = (undefined4)uStack_60;
    uVar4 = uStack_60._4_4_;
    uStack_38 = local_58._12_4_;
    uStack_34 = local_48._12_4_;
    lVar26 = CONCAT44(local_48._0_4_,local_58._0_4_);
    uStack_60 = CONCAT44(local_68._4_4_,local_78._4_4_);
    local_58._4_4_ = uVar1;
    local_58._0_4_ = (undefined4)uStack_70;
    local_58._12_4_ = local_48._8_4_;
    local_48._8_4_ = uStack_70._4_4_;
    local_48._12_4_ = uVar4;
    local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
    uStack_70 = lVar26;
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,1,bd,0);
LAB_003f9a53:
    cVar2 = piVar3[1];
LAB_003f9a62:
    fliplr = 1;
    goto LAB_003f9d24;
  case 8:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    goto LAB_003f9d6b;
  case 9:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    lVar5 = 0;
    iidentity4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,stride,0,bd,0);
    uVar1 = local_78._4_4_;
    auVar7._0_8_ = CONCAT44((undefined4)uStack_60,(undefined4)uStack_70);
    auVar7._8_4_ = uStack_70._4_4_;
    auVar7._12_4_ = uStack_60._4_4_;
    auVar13._0_8_ = CONCAT44(local_48._8_4_,local_58._8_4_);
    auVar13._8_4_ = local_58._12_4_;
    auVar13._12_4_ = local_48._12_4_;
    local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
    uStack_70 = CONCAT44(local_48._0_4_,local_58._0_4_);
    uStack_60 = CONCAT44(local_68._4_4_,uVar1);
    local_58._8_8_ = auVar13._0_8_;
    local_58._0_8_ = auVar7._0_8_;
    local_48._8_8_ = auVar13._8_8_;
    local_48._0_8_ = auVar7._8_8_;
    auVar8 = pmovsxwq(local_48,0x16a116a1);
    auVar10 = pmovsxwq(local_58,0x8000800);
    do {
      auVar15 = pmuldq(*(undefined1 (*) [16])((long)&local_78 + lVar5),auVar8);
      auVar14._0_8_ = CONCAT44(auVar15._4_4_ + auVar10._4_4_,auVar15._0_4_ + auVar10._0_4_);
      auVar14._8_4_ = auVar15._8_4_ + auVar10._8_4_;
      auVar14._12_4_ = auVar15._12_4_ + auVar10._12_4_;
      uVar1 = *(undefined4 *)((long)&local_78 + lVar5 + 4);
      auVar21._4_4_ = uVar1;
      auVar21._0_4_ = uVar1;
      auVar21._8_4_ = uVar1;
      auVar21._12_4_ = uVar1;
      auVar15 = pmuldq(auVar21,auVar8);
      auVar22._0_8_ = CONCAT44(auVar15._4_4_ + auVar10._4_4_,auVar15._0_4_ + auVar10._0_4_);
      auVar22._8_4_ = auVar15._8_4_ + auVar10._8_4_;
      auVar22._12_4_ = auVar15._12_4_ + auVar10._12_4_;
      *(ulong *)((long)&local_78 + lVar5) =
           CONCAT44((int)(auVar22._0_8_ >> 0xc),(int)(auVar14._0_8_ >> 0xc));
      *(ulong *)((long)&uStack_70 + lVar5) =
           CONCAT44((int)(auVar22._8_8_ >> 0xc),(int)(auVar14._8_8_ >> 0xc));
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    goto LAB_003f9b6f;
  case 10:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    iidentity4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,stride,0,bd,0);
    break;
  case 0xb:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    lVar5 = 0;
    idct4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    uVar1 = local_78._4_4_;
    auVar6._0_8_ = CONCAT44((undefined4)uStack_60,(undefined4)uStack_70);
    auVar6._8_4_ = uStack_70._4_4_;
    auVar6._12_4_ = uStack_60._4_4_;
    auVar11._0_8_ = CONCAT44(local_48._8_4_,local_58._8_4_);
    auVar11._8_4_ = local_58._12_4_;
    auVar11._12_4_ = local_48._12_4_;
    local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
    uStack_70 = CONCAT44(local_48._0_4_,local_58._0_4_);
    uStack_60 = CONCAT44(local_68._4_4_,uVar1);
    local_58._8_8_ = auVar11._0_8_;
    local_58._0_8_ = auVar6._0_8_;
    local_48._8_8_ = auVar11._8_8_;
    local_48._0_8_ = auVar6._8_8_;
    auVar8 = pmovsxwq(local_48,0x16a116a1);
    auVar10 = pmovsxwq(local_58,0x8000800);
    do {
      auVar15 = pmuldq(*(undefined1 (*) [16])((long)&local_78 + lVar5),auVar8);
      auVar12._0_8_ = CONCAT44(auVar15._4_4_ + auVar10._4_4_,auVar15._0_4_ + auVar10._0_4_);
      auVar12._8_4_ = auVar15._8_4_ + auVar10._8_4_;
      auVar12._12_4_ = auVar15._12_4_ + auVar10._12_4_;
      uVar1 = *(undefined4 *)((long)&local_78 + lVar5 + 4);
      auVar19._4_4_ = uVar1;
      auVar19._0_4_ = uVar1;
      auVar19._8_4_ = uVar1;
      auVar19._12_4_ = uVar1;
      auVar15 = pmuldq(auVar19,auVar8);
      auVar20._0_8_ = CONCAT44(auVar15._4_4_ + auVar10._4_4_,auVar15._0_4_ + auVar10._0_4_);
      auVar20._8_4_ = auVar15._8_4_ + auVar10._8_4_;
      auVar20._12_4_ = auVar15._12_4_ + auVar10._12_4_;
      *(ulong *)((long)&local_78 + lVar5) =
           CONCAT44((int)(auVar20._0_8_ >> 0xc),(int)(auVar12._0_8_ >> 0xc));
      *(ulong *)((long)&uStack_70 + lVar5) =
           CONCAT44((int)(auVar20._8_8_ >> 0xc),(int)(auVar12._8_8_ >> 0xc));
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    goto LAB_003f9b6f;
  case 0xc:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    iidentity4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,stride,0,bd,0);
LAB_003f991d:
    uVar1 = (undefined4)uStack_60;
    uVar4 = uStack_60._4_4_;
    uStack_38 = local_58._12_4_;
    uStack_34 = local_48._12_4_;
    lVar26 = CONCAT44(local_48._0_4_,local_58._0_4_);
    uStack_60 = CONCAT44(local_68._4_4_,local_78._4_4_);
    local_58._4_4_ = uVar1;
    local_58._0_4_ = (undefined4)uStack_70;
    local_58._12_4_ = local_48._8_4_;
    local_48._8_4_ = uStack_70._4_4_;
    local_48._12_4_ = uVar4;
    local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
    uStack_70 = lVar26;
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,1,bd,0);
    goto LAB_003f9d0e;
  case 0xd:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    lVar5 = 0;
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    uVar1 = local_78._4_4_;
    auVar9._0_8_ = CONCAT44((undefined4)uStack_60,(undefined4)uStack_70);
    auVar9._8_4_ = uStack_70._4_4_;
    auVar9._12_4_ = uStack_60._4_4_;
    auVar17._0_8_ = CONCAT44(local_48._8_4_,local_58._8_4_);
    auVar17._8_4_ = local_58._12_4_;
    auVar17._12_4_ = local_48._12_4_;
    local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
    uStack_70 = CONCAT44(local_48._0_4_,local_58._0_4_);
    uStack_60 = CONCAT44(local_68._4_4_,uVar1);
    local_58._8_8_ = auVar17._0_8_;
    local_58._0_8_ = auVar9._0_8_;
    local_48._8_8_ = auVar17._8_8_;
    local_48._0_8_ = auVar9._8_8_;
    auVar8 = pmovsxwq(local_48,0x16a116a1);
    auVar10 = pmovsxwq(local_58,0x8000800);
    do {
      auVar15 = pmuldq(*(undefined1 (*) [16])((long)&local_78 + lVar5),auVar8);
      auVar18._0_8_ = CONCAT44(auVar15._4_4_ + auVar10._4_4_,auVar15._0_4_ + auVar10._0_4_);
      auVar18._8_4_ = auVar15._8_4_ + auVar10._8_4_;
      auVar18._12_4_ = auVar15._12_4_ + auVar10._12_4_;
      uVar1 = *(undefined4 *)((long)&local_78 + lVar5 + 4);
      auVar24._4_4_ = uVar1;
      auVar24._0_4_ = uVar1;
      auVar24._8_4_ = uVar1;
      auVar24._12_4_ = uVar1;
      auVar15 = pmuldq(auVar24,auVar8);
      auVar25._0_8_ = CONCAT44(auVar15._4_4_ + auVar10._4_4_,auVar15._0_4_ + auVar10._0_4_);
      auVar25._8_4_ = auVar15._8_4_ + auVar10._8_4_;
      auVar25._12_4_ = auVar15._12_4_ + auVar10._12_4_;
      *(ulong *)((long)&local_78 + lVar5) =
           CONCAT44((int)(auVar25._0_8_ >> 0xc),(int)(auVar18._0_8_ >> 0xc));
      *(ulong *)((long)&uStack_70 + lVar5) =
           CONCAT44((int)(auVar25._8_8_ >> 0xc),(int)(auVar18._8_8_ >> 0xc));
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
LAB_003f9b6f:
    cVar2 = piVar3[1];
    goto LAB_003f9d1d;
  case 0xe:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    iidentity4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,stride,0,bd,0);
LAB_003f9d6b:
    uVar1 = (undefined4)uStack_60;
    uVar4 = uStack_60._4_4_;
    uStack_38 = local_58._12_4_;
    uStack_34 = local_48._12_4_;
    lVar26 = CONCAT44(local_48._0_4_,local_58._0_4_);
    uStack_60 = CONCAT44(local_68._4_4_,local_78._4_4_);
    local_58._4_4_ = uVar1;
    local_58._0_4_ = (undefined4)uStack_70;
    local_58._12_4_ = local_48._8_4_;
    local_48._8_4_ = uStack_70._4_4_;
    local_48._12_4_ = uVar4;
    local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
    uStack_70 = lVar26;
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,1,bd,0);
    cVar2 = piVar3[1];
    fliplr = 0;
LAB_003f9dfa:
    flipud = 1;
    goto LAB_003f9e00;
  case 0xf:
    local_78 = *(longlong *)input;
    uStack_70 = *(longlong *)(input + 2);
    local_68 = *(undefined8 *)(input + 4);
    uStack_60 = *(undefined8 *)(input + 6);
    local_58 = *(undefined1 (*) [16])(input + 8);
    local_48 = *(undefined1 (*) [16])(input + 0xc);
    lVar5 = 0;
    iadst4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,0,bd,0);
    uVar1 = local_78._4_4_;
    auVar8._0_8_ = CONCAT44((undefined4)uStack_60,(undefined4)uStack_70);
    auVar8._8_4_ = uStack_70._4_4_;
    auVar8._12_4_ = uStack_60._4_4_;
    auVar10._0_8_ = CONCAT44(local_48._8_4_,local_58._8_4_);
    auVar10._8_4_ = local_58._12_4_;
    auVar10._12_4_ = local_48._12_4_;
    local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
    uStack_70 = CONCAT44(local_48._0_4_,local_58._0_4_);
    uStack_60 = CONCAT44(local_68._4_4_,uVar1);
    local_58._8_8_ = auVar10._0_8_;
    local_58._0_8_ = auVar8._0_8_;
    local_48._8_8_ = auVar10._8_8_;
    local_48._0_8_ = auVar8._8_8_;
    auVar8 = pmovsxwq(local_48,0x16a116a1);
    auVar10 = pmovsxwq(local_58,0x8000800);
    do {
      auVar15 = pmuldq(*(undefined1 (*) [16])((long)&local_78 + lVar5),auVar8);
      auVar16._0_8_ = CONCAT44(auVar15._4_4_ + auVar10._4_4_,auVar15._0_4_ + auVar10._0_4_);
      auVar16._8_4_ = auVar15._8_4_ + auVar10._8_4_;
      auVar16._12_4_ = auVar15._12_4_ + auVar10._12_4_;
      uVar1 = *(undefined4 *)((long)&local_78 + lVar5 + 4);
      auVar15._4_4_ = uVar1;
      auVar15._0_4_ = uVar1;
      auVar15._8_4_ = uVar1;
      auVar15._12_4_ = uVar1;
      auVar15 = pmuldq(auVar15,auVar8);
      auVar23._0_8_ = CONCAT44(auVar15._4_4_ + auVar10._4_4_,auVar15._0_4_ + auVar10._0_4_);
      auVar23._8_4_ = auVar15._8_4_ + auVar10._8_4_;
      auVar23._12_4_ = auVar15._12_4_ + auVar10._12_4_;
      *(ulong *)((long)&local_78 + lVar5) =
           CONCAT44((int)(auVar23._0_8_ >> 0xc),(int)(auVar16._0_8_ >> 0xc));
      *(ulong *)((long)&uStack_70 + lVar5) =
           CONCAT44((int)(auVar23._8_8_ >> 0xc),(int)(auVar16._8_8_ >> 0xc));
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    cVar2 = piVar3[1];
    goto LAB_003f9a62;
  default:
    goto switchD_003f937c_default;
  }
  uVar1 = (undefined4)uStack_60;
  uVar4 = uStack_60._4_4_;
  uStack_38 = local_58._12_4_;
  uStack_34 = local_48._12_4_;
  lVar26 = CONCAT44(local_48._0_4_,local_58._0_4_);
  uStack_60 = CONCAT44(local_68._4_4_,local_78._4_4_);
  local_58._4_4_ = uVar1;
  local_58._0_4_ = (undefined4)uStack_70;
  local_58._12_4_ = local_48._8_4_;
  local_48._8_4_ = uStack_70._4_4_;
  local_48._12_4_ = uVar4;
  local_78 = CONCAT44((undefined4)local_68,(undefined4)local_78);
  uStack_70 = lVar26;
  idct4x4_sse4_1((__m128i *)&local_78,(__m128i *)&local_78,0xc,1,bd,0);
LAB_003f9d0e:
  cVar2 = piVar3[1];
LAB_003f9d1d:
  fliplr = 0;
LAB_003f9d24:
  flipud = 0;
LAB_003f9e00:
  write_buffer_4x4((__m128i *)&local_78,output,stride,fliplr,flipud,-(int)cVar2,bd);
switchD_003f937c_default:
  return;
}

Assistant:

void av1_inv_txfm2d_add_4x4_sse4_1(const int32_t *input, uint16_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  __m128i in[4];
  const int8_t *shift = av1_inv_txfm_shift_ls[TX_4X4];

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case DCT_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case ADST_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case FLIPADST_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 1, -shift[1], bd);
      break;
    case DCT_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 0, -shift[1], bd);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 1, -shift[1], bd);
      break;
    case ADST_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 0, -shift[1], bd);
      break;
    case FLIPADST_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 1, -shift[1], bd);
      break;
    case IDTX:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case V_DCT:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case H_DCT:
      load_buffer_4x4(input, in);
      idct4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case V_ADST:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case H_ADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 0, -shift[1], bd);
      break;
    case V_FLIPADST:
      load_buffer_4x4(input, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 0, 1, -shift[1], bd);
      break;
    case H_FLIPADST:
      load_buffer_4x4(input, in);
      iadst4x4_sse4_1(in, in, INV_COS_BIT, 0, bd, 0);
      transpose_32bit_4x4(in, in);
      iidentity4_sse4_1(in, in, INV_COS_BIT, 1, bd, 0);
      write_buffer_4x4(in, output, stride, 1, 0, -shift[1], bd);
      break;
    default: assert(0);
  }
}